

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1-ni.c
# Opt level: O0

void sha1_ni_copyfrom(ssh_hash *hcopy,ssh_hash *horig)

{
  ssh_hashalg *psVar1;
  void *ptf_save;
  sha1_ni *orig;
  sha1_ni *copy;
  ssh_hash *horig_local;
  ssh_hash *hcopy_local;
  
  psVar1 = hcopy[-2].vt;
  memcpy(hcopy + -9,horig + -9,0xa0);
  hcopy[-2].vt = psVar1;
  hcopy[-1].binarysink_ = (BinarySink *)&hcopy[-2].binarysink_;
  hcopy->binarysink_ = (BinarySink *)&hcopy[-2].binarysink_;
  return;
}

Assistant:

static void sha1_ni_copyfrom(ssh_hash *hcopy, ssh_hash *horig)
{
    sha1_ni *copy = container_of(hcopy, sha1_ni, hash);
    sha1_ni *orig = container_of(horig, sha1_ni, hash);

    void *ptf_save = copy->pointer_to_free;
    *copy = *orig; /* structure copy */
    copy->pointer_to_free = ptf_save;

    BinarySink_COPIED(copy);
    BinarySink_DELEGATE_INIT(&copy->hash, copy);
}